

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoomCreateView.cpp
# Opt level: O2

void __thiscall RoomCreateView::display(RoomCreateView *this)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int strength;
  RoomCreateUpdateForm *this_00;
  long lVar5;
  Controller *this_01;
  View *pVVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  Room room;
  undefined4 extraout_var;
  
  std::operator<<((ostream *)&std::cout,"To create a room fill in the details asked below: \n");
  std::operator<<((ostream *)&std::cout,"Enter room number: ");
  iVar4 = Input::getInt();
  std::operator<<((ostream *)&std::cout,"Enter strength: ");
  strength = Input::getInt();
  std::operator<<((ostream *)&std::cout,"Audio required? (y/n): ");
  cVar1 = Input::getChar();
  std::operator<<((ostream *)&std::cout,"Video required? (y/n): ");
  cVar2 = Input::getChar();
  this_00 = (RoomCreateUpdateForm *)operator_new(0x38);
  RoomCreateUpdateForm::RoomCreateUpdateForm
            (this_00,iVar4,strength,cVar1 == 'y',cVar2 == 'y',(Room *)0x0);
  (this->super_CreateView<Room>).form = (ModelForm<Room> *)this_00;
  bVar3 = Form::isValid((Form *)this_00);
  if (bVar3) {
    iVar4 = (*(((this->super_CreateView<Room>).form)->super_Form)._vptr_Form[1])();
    lVar5 = CONCAT44(extraout_var,iVar4);
    room.super_Model<Room>.id = *(int *)(lVar5 + 8);
    room.super_Model<Room>._vptr_Model = (_func_int **)&PTR_save_0012c070;
    room._20_2_ = *(undefined2 *)(lVar5 + 0x14);
    room._12_8_ = *(undefined8 *)(lVar5 + 0xc);
    iVar4 = Room::getRoomNumber(&room);
    std::__cxx11::to_string(&local_68,iVar4);
    std::operator+(&local_88,"Room #",&local_68);
    std::operator+(&bStack_a8,&local_88," created successfully.\n");
    std::operator<<((ostream *)&std::cout,(string *)&bStack_a8);
    std::__cxx11::string::~string((string *)&bStack_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    Form::printErrors(&((this->super_CreateView<Room>).form)->super_Form);
  }
  this_01 = Controller::getInstance();
  std::__cxx11::string::string((string *)&bStack_a8,"admin-panel",(allocator *)&local_88);
  pVVar6 = Controller::getView(this_01,&bStack_a8);
  View::response->view = pVVar6;
  std::__cxx11::string::~string((string *)&bStack_a8);
  return;
}

Assistant:

void RoomCreateView::display() {
    cout << "To create a room fill in the details asked below: \n";
    int roomNumber, strength;
    bool audio, video;
    cout << "Enter room number: ";
    roomNumber = Input::getInt();
    cout << "Enter strength: ";
    strength = Input::getInt();
    cout << "Audio required? (y/n): ";
    audio = (Input::getChar() == 'y');
    cout << "Video required? (y/n): ";
    video = (Input::getChar() == 'y');
    form = new RoomCreateUpdateForm(roomNumber, strength, audio, video);
    if (form->isValid()) {
        Room room = form->save();
        cout << "Room #" + to_string(room.getRoomNumber()) + " created successfully.\n";
    } else {
        form->printErrors();
    }
    response->view = Controller::getInstance().getView("admin-panel");
}